

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O1

void __thiscall
QMdiSubWindowPrivate::updateWindowTitle(QMdiSubWindowPrivate *this,bool isRequestFromChild)

{
  long lVar1;
  Data *pDVar2;
  byte bVar3;
  QWidget *pQVar4;
  undefined7 in_register_00000031;
  QWidget *this_00;
  long in_FS_OFFSET;
  bool bVar5;
  QStringView QVar6;
  QStringView QVar7;
  QString local_90;
  QString local_78;
  QString local_60;
  QString local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
  if ((((int)CONCAT71(in_register_00000031,isRequestFromChild) == 0) ||
      (QWidget::windowTitle(&local_48,pQVar4), local_48.d.size == 0)) ||
     ((this->lastChildWindowTitle).d.size == 0)) {
    bVar5 = false;
    bVar3 = 0;
  }
  else {
    QWidget::windowTitle(&local_60,pQVar4);
    lVar1 = (this->lastChildWindowTitle).d.size;
    bVar5 = true;
    if (lVar1 == local_60.d.size) {
      QVar6.m_data = (this->lastChildWindowTitle).d.ptr;
      QVar6.m_size = lVar1;
      QVar7.m_data = local_60.d.ptr;
      QVar7.m_size = local_60.d.size;
      bVar3 = QtPrivate::equalStrings(QVar6,QVar7);
      bVar3 = bVar3 ^ 1;
    }
    else {
      bVar3 = 1;
    }
  }
  if ((bVar5) && (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0)) {
    LOCK();
    ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,2,0x10);
    }
  }
  if ((isRequestFromChild) && (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0)) {
    LOCK();
    ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (bVar3 == 0) {
    this_00 = pQVar4;
    if (isRequestFromChild) {
      pDVar2 = (this->baseWidget).wp.d;
      if ((pDVar2 == (Data *)0x0) || (*(int *)(pDVar2 + 4) == 0)) {
        this_00 = (QWidget *)0x0;
      }
      else {
        this_00 = (QWidget *)(this->baseWidget).wp.value;
      }
    }
    if (this_00 == (QWidget *)0x0) {
      bVar5 = true;
    }
    else {
      QWidget::windowTitle(&local_78,this_00);
      bVar5 = local_78.d.size == 0;
      if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
    if (!bVar5) {
      this->ignoreWindowTitleChange = true;
      QWidget::windowTitle(&local_90,this_00);
      QWidget::setWindowTitle(pQVar4,&local_90);
      if (&(local_90.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_90.d.d)->super_QArrayData,2,0x10);
        }
      }
      pQVar4 = QMdiSubWindow::maximizedButtonsWidget((QMdiSubWindow *)pQVar4);
      if (pQVar4 != (QWidget *)0x0) {
        setNewWindowTitle(this);
      }
      this->ignoreWindowTitleChange = false;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMdiSubWindowPrivate::updateWindowTitle(bool isRequestFromChild)
{
    Q_Q(QMdiSubWindow);
    if (isRequestFromChild && !q->windowTitle().isEmpty() && !lastChildWindowTitle.isEmpty()
            && lastChildWindowTitle != q->windowTitle()) {
        return;
    }

    QWidget *titleWidget = nullptr;
    if (isRequestFromChild)
        titleWidget = baseWidget;
    else
        titleWidget = q;
    if (!titleWidget || titleWidget->windowTitle().isEmpty())
        return;

    ignoreWindowTitleChange = true;
    q->setWindowTitle(titleWidget->windowTitle());
    if (q->maximizedButtonsWidget())
        setNewWindowTitle();
    ignoreWindowTitleChange = false;
}